

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_allocation.c
# Opt level: O0

void PaUtil_FreeAllAllocations(PaUtilAllocationGroup *group)

{
  long in_RDI;
  PaUtilAllocationGroupLink *previous;
  PaUtilAllocationGroupLink *current;
  undefined8 *local_18;
  undefined8 *local_10;
  
  local_10 = *(undefined8 **)(in_RDI + 0x18);
  local_18 = (undefined8 *)0x0;
  for (; local_10 != (undefined8 *)0x0; local_10 = (undefined8 *)*local_10) {
    PaUtil_FreeMemory((void *)0x107c65);
    local_10[1] = 0;
    local_18 = local_10;
  }
  if (local_18 != (undefined8 *)0x0) {
    *local_18 = *(undefined8 *)(in_RDI + 0x10);
    *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(in_RDI + 0x18);
    *(undefined8 *)(in_RDI + 0x18) = 0;
  }
  return;
}

Assistant:

void PaUtil_FreeAllAllocations( PaUtilAllocationGroup* group )
{
    struct PaUtilAllocationGroupLink *current = group->allocations;
    struct PaUtilAllocationGroupLink *previous = 0;

    /* free all buffers in the allocations list */
    while( current )
    {
        PaUtil_FreeMemory( current->buffer );
        current->buffer = 0;

        previous = current;
        current = current->next;
    }

    /* link the former allocations list onto the front of the spareLinks list */
    if( previous )
    {
        previous->next = group->spareLinks;
        group->spareLinks = group->allocations;
        group->allocations = 0;
    }
}